

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool google::protobuf::compiler::js::anon_unknown_0::HasRepeatedFields
               (GeneratorOptions *options,Descriptor *desc)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; lVar3 = (long)*(int *)((long)&(options->library).field_2 + 8), lVar5 < lVar3;
      lVar5 = lVar5 + 1) {
    sVar1 = (options->namespace_prefix)._M_string_length;
    if (*(int *)(sVar1 + 0x3c + lVar4) == 3) {
      bVar2 = FieldDescriptor::is_map((FieldDescriptor *)(sVar1 + lVar4));
      if (!bVar2) break;
    }
    lVar4 = lVar4 + 0x98;
  }
  return lVar5 < lVar3;
}

Assistant:

bool HasRepeatedFields(const GeneratorOptions& options,
                       const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); i++) {
    if (desc->field(i)->is_repeated() && !desc->field(i)->is_map()) {
      return true;
    }
  }
  return false;
}